

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O2

DdNode * UAbuildSubset(DdManager *dd,DdNode *node,ApproxInfo *info)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *T;
  DdNode *pDVar3;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *key;
  NodeData *infoN;
  
  key = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (key->index == 0x7fffffff) {
    return node;
  }
  iVar1 = st__lookup(info->table,(char *)key,(char **)&infoN);
  if (iVar1 == 0) {
    fwrite("Something is wrong, ought to be in info table\n",0x2e,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INTERNAL_ERROR;
  }
  else {
    if (infoN->replace == '\x01') {
      return info->zero;
    }
    if (key == node) {
      pDVar3 = infoN->resultP;
    }
    else {
      pDVar3 = infoN->resultN;
    }
    if (pDVar3 != (DdNode *)0x0) {
      return pDVar3;
    }
    uVar5 = (ulong)((uint)node & 1);
    pDVar3 = (key->type).kids.E;
    pDVar2 = UAbuildSubset(dd,(DdNode *)((ulong)(key->type).kids.T ^ uVar5),info);
    if (pDVar2 != (DdNode *)0x0) {
      T = (DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe);
      T->ref = T->ref + 1;
      pDVar3 = UAbuildSubset(dd,(DdNode *)(uVar5 ^ (ulong)pDVar3),info);
      if (pDVar3 != (DdNode *)0x0) {
        pDVar6 = (DdNode *)((ulong)pDVar3 & 0xfffffffffffffffe);
        pDVar6->ref = pDVar6->ref + 1;
        if (((ulong)pDVar2 & 1) == 0) {
          pDVar4 = pDVar2;
          pDVar7 = T;
          if ((pDVar2 == pDVar3) ||
             (pDVar4 = cuddUniqueInter(dd,key->index,pDVar2,pDVar3), pDVar7 = pDVar6,
             pDVar4 != (DdNode *)0x0)) {
LAB_00608a5f:
            T->ref = T->ref - 1;
            pDVar7->ref = pDVar7->ref - 1;
            if (key != node) {
              infoN->resultN = pDVar4;
              return pDVar4;
            }
            infoN->resultP = pDVar4;
            return pDVar4;
          }
          Cudd_RecursiveDeref(dd,pDVar3);
        }
        else {
          pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
          pDVar2 = T;
          if ((T == pDVar3) ||
             (pDVar2 = cuddUniqueInter(dd,key->index,T,pDVar3), pDVar2 != (DdNode *)0x0)) {
            pDVar4 = (DdNode *)((ulong)pDVar2 ^ 1);
            pDVar7 = pDVar6;
            goto LAB_00608a5f;
          }
          Cudd_RecursiveDeref(dd,pDVar3);
          pDVar2 = T;
        }
      }
      Cudd_RecursiveDeref(dd,pDVar2);
    }
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
UAbuildSubset(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  ApproxInfo * info /* node info */)
{

    DdNode *Nt, *Ne, *N, *t, *e, *r;
    NodeData *infoN;

    if (Cudd_IsConstant(node))
        return(node);

    N = Cudd_Regular(node);

    if ( st__lookup(info->table, (const char *)N, (char **)&infoN)) {
        if (infoN->replace == TRUE) {
            return(info->zero);
        }
        if (N == node ) {
            if (infoN->resultP != NULL) {
                return(infoN->resultP);
            }
        } else {
            if (infoN->resultN != NULL) {
                return(infoN->resultN);
            }
        }
    } else {
        (void) fprintf(dd->err,
                       "Something is wrong, ought to be in info table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }

    Nt = Cudd_NotCond(cuddT(N), Cudd_IsComplement(node));
    Ne = Cudd_NotCond(cuddE(N), Cudd_IsComplement(node));

    t = UAbuildSubset(dd, Nt, info);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = UAbuildSubset(dd, Ne, info);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if (N == node) {
        infoN->resultP = r;
    } else {
        infoN->resultN = r;
    }

    return(r);

}